

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::Phase
          (Phase<std::complex<double>_> *this,int qubit,angle_type *angle,bool fixed)

{
  double dVar1;
  
  QGate1<std::complex<double>_>::QGate1(&this->super_QGate1<std::complex<double>_>,qubit);
  (this->super_QGate1<std::complex<double>_>).field_0xc = fixed;
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00136ba8;
  dVar1 = angle->sin_;
  (this->angle_).cos_ = angle->cos_;
  (this->angle_).sin_ = dVar1;
  return;
}

Assistant:

Phase( const int qubit , const angle_type& angle ,
               const bool fixed = false )
        : QGate1< T >( qubit )
        , angle_( angle )
        , QAdjustable( fixed )
        { }